

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

ConstPixelBufferAccess *
vkt::image::anon_unknown_0::getLayerOrSlice
          (ConstPixelBufferAccess *__return_storage_ptr__,ImageType imageType,
          ConstPixelBufferAccess *access,deUint32 layer)

{
  int iVar1;
  int height;
  deUint32 layer_local;
  ConstPixelBufferAccess *access_local;
  ImageType imageType_local;
  
  if (imageType != IMAGE_TYPE_1D) {
    if (imageType == IMAGE_TYPE_1D_ARRAY) {
      iVar1 = tcu::ConstPixelBufferAccess::getWidth(access);
      tcu::getSubregion(__return_storage_ptr__,access,0,layer,iVar1,1);
      return __return_storage_ptr__;
    }
    if (imageType != IMAGE_TYPE_2D) {
      if (imageType - IMAGE_TYPE_2D_ARRAY < 4) {
        iVar1 = tcu::ConstPixelBufferAccess::getWidth(access);
        height = tcu::ConstPixelBufferAccess::getHeight(access);
        tcu::getSubregion(__return_storage_ptr__,access,0,0,layer,iVar1,height,1);
        return __return_storage_ptr__;
      }
      if (imageType != IMAGE_TYPE_BUFFER) {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
    }
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(__return_storage_ptr__,access);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess getLayerOrSlice (const ImageType					imageType,
											 const tcu::ConstPixelBufferAccess&	access,
											 const deUint32						layer)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_BUFFER:
			DE_ASSERT(layer == 0);
			return access;

		case IMAGE_TYPE_1D_ARRAY:
			return tcu::getSubregion(access, 0, layer, access.getWidth(), 1);

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return tcu::getSubregion(access, 0, 0, layer, access.getWidth(), access.getHeight(), 1);

		default:
			DE_FATAL("Unknown image type");
			return tcu::ConstPixelBufferAccess();
	}
}